

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O2

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar3 = container1->cardinality;
  iVar4 = run_container_cardinality(container2);
  uVar5 = 0;
  if (iVar3 <= iVar4) {
    uVar6 = 0;
    for (; ((int)uVar6 < container1->cardinality && ((int)uVar5 < container2->n_runs));
        uVar5 = (ulong)((int)uVar5 + (uint)(uVar7 < uVar2))) {
      uVar1 = container2->runs[uVar5].value;
      uVar2 = container1->array[uVar6];
      if (uVar2 < uVar1) {
        uVar5 = 0;
        goto LAB_0011aa46;
      }
      uVar7 = (uint)container2->runs[uVar5].length + (uint)uVar1;
      uVar6 = (uVar6 + 1) - (uint)(uVar7 < uVar2);
    }
    uVar5 = (ulong)(uVar6 == container1->cardinality);
  }
LAB_0011aa46:
  return SUB81(uVar5,0);
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}